

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPCInstPrinter.c
# Opt level: O0

void printTLSCall(MCInst *MI,uint OpNo,SStream *O)

{
  char *in_RDX;
  undefined4 in_ESI;
  MCInst *in_RDI;
  undefined4 in_stack_fffffffffffffff0;
  
  set_mem_access(in_RDI,true);
  SStream_concat0((SStream *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_RDX);
  printOperand(MI,OpNo,O);
  SStream_concat0((SStream *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_RDX);
  set_mem_access(in_RDI,false);
  return;
}

Assistant:

static void printTLSCall(MCInst *MI, unsigned OpNo, SStream *O)
{
	set_mem_access(MI, true);
	//printBranchOperand(MI, OpNo, O);

	// On PPC64, VariantKind is VK_None, but on PPC32, it's VK_PLT, and it must
	// come at the _end_ of the expression.

	SStream_concat0(O, "(");
	printOperand(MI, OpNo + 1, O);
	SStream_concat0(O, ")");
	set_mem_access(MI, false);
}